

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

bool __thiscall r_exec::Group::load(Group *this,View *view,Code *object)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined4 extraout_var;
  Controller *c;
  mapped_type *pmVar6;
  MDLController *this_00;
  Group *pGVar7;
  bool bVar8;
  uint64_t i;
  ulong uVar9;
  float fVar10;
  Code *object_local;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  string str;
  
  object_local = object;
  (*(object->super__Object)._vptr__Object[4])(object,0);
  uVar1 = r_code::Atom::getDescriptor();
  bVar8 = true;
  switch(uVar1) {
  case 0xc4:
    for (uVar9 = 0; uVar3 = (*(object->super__Object)._vptr__Object[10])(object),
        uVar9 < (uVar3 & 0xffff); uVar9 = uVar9 + 1) {
      iVar4 = (*(object_local->super__Object)._vptr__Object[9])(object_local,uVar9 & 0xffff);
      r_code::list<r_code::Code_*>::push_back
                ((list<r_code::Code_*> *)(CONCAT44(extraout_var,iVar4) + 0x18),&object_local);
      object = object_local;
    }
  case 0xc3:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->other_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    break;
  case 200:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->group_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    local_54 = get_c_act(this);
    local_58 = get_c_act_thr(this);
    local_5c = get_c_sln(this);
    local_60 = get_c_sln_thr(this);
    local_64 = View::get_vis(view);
    fVar10 = get_vis_thr(this);
    if (((local_58 < local_54) && (local_60 < local_5c)) && (fVar10 < local_64)) {
      bVar2 = View::get_cov(view);
      str._M_dataplus._M_p = (pointer)this;
      pmVar5 = std::__detail::
               _Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&object[6].markers.free_cell_count,(key_type *)&str);
      *pmVar5 = bVar2;
    }
    break;
  case 0xc9:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    this_00 = (MDLController *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)this_00,&view->super_View);
    goto LAB_00181714;
  case 0xca:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    r_code::Utils::GetString<r_code::Code>(&str,(Code *)(view->super_View).object.object,1);
    c = CPPPrograms::New(&str,&view->super_View);
    if (c == (Controller *)0x0) {
      std::__cxx11::string::~string((string *)&str);
      bVar8 = false;
    }
    else {
      core::P<r_exec::Controller>::operator=(&view->controller,c);
      bVar2 = is_active_pgm(this,view);
      if (bVar2) {
        (*(c->super__Object)._vptr__Object[5])(c);
      }
      std::__cxx11::string::~string((string *)&str);
    }
    break;
  case 0xcb:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->input_less_ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    this_00 = (MDLController *)operator_new(200);
    InputLessPGMController::InputLessPGMController
              ((InputLessPGMController *)this_00,&view->super_View);
    goto LAB_00181714;
  case 0xcc:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->anti_ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    this_00 = (MDLController *)operator_new(200);
    AntiPGMController::AntiPGMController((AntiPGMController *)this_00,&view->super_View);
LAB_00181714:
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_00);
LAB_00181723:
    bVar2 = is_active_pgm(this,view);
    if (bVar2) {
      (*(this_00->super_HLPController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])(this_00);
    }
    break;
  case 0xcd:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    this_00 = (MDLController *)operator_new(0x1e8);
    CSTController::CSTController((CSTController *)this_00,&view->super_View);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_00);
    pGVar7 = get_secondary_group(this);
    CSTController::set_secondary_host((CSTController *)this_00,pGVar7);
    goto LAB_00181723;
  case 0xce:
    str._M_dataplus._M_p = (pointer)View::get_oid(view);
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ipgm_views,(key_type *)&str);
    core::P<r_exec::View>::operator=(pmVar6,view);
    this_00 = MDLController::New(view,(bool *)&str);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_00);
    if ((char)str._M_dataplus._M_p == '\x01') {
      pGVar7 = get_secondary_group(this);
      load_secondary_mdl_controller(pGVar7,view);
    }
    goto LAB_00181723;
  }
  return bVar8;
}

Assistant:

bool Group::load(View *view, Code *object)
{
    switch (object->code(0).getDescriptor()) {
    case Atom::GROUP: {
        group_views[view->get_oid()] = view;
        // init viewing_group.
        bool viewing_c_active = get_c_act() > get_c_act_thr();
        bool viewing_c_salient = get_c_sln() > get_c_sln_thr();
        bool viewed_visible = view->get_vis() > get_vis_thr();

        if (viewing_c_active && viewing_c_salient && viewed_visible) { // visible group in a c-salient, c-active group.
            ((Group *)object)->viewing_groups[this] = view->get_cov();    // init the group's viewing groups.
        }

        break;
    }

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view); // now will be added to the deadline at start time.
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view); // now will be added to the deadline at start time.

        if (!c) {
            return false;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::COMPOSITE_STATE: {
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MODEL: {
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->load_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
        }

        break;
    }

    case Atom::MARKER: // populate the marker set of the referenced objects.
        for (uint64_t i = 0; i < object->references_size(); ++i) {
            object->get_reference(i)->markers.push_back(object);
        }

        other_views[view->get_oid()] = view;
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        break;
    }

    return true;
}